

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_segwit_tests.cpp
# Opt level: O2

void __thiscall
script_segwit_tests::IsPayToWitnessScriptHash_Invalid_NotOp0::test_method
          (IsPayToWitnessScriptHash_Invalid_NotOp0 *this)

{
  long lVar1;
  bool bVar2;
  CScript *this_00;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string msg;
  span<const_std::byte,_18446744073709551615UL> b;
  const_string file;
  char *local_c0;
  char *local_b8;
  undefined1 local_b0 [8];
  bool local_a8;
  undefined7 uStack_a7;
  undefined1 *local_a0;
  char **local_98;
  assertion_result local_90;
  undefined1 *local_78;
  undefined1 *local_70;
  char *local_68;
  char *local_60;
  CScript notp2wsh;
  uint256 dummy;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  dummy.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  dummy.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  dummy.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  dummy.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  dummy.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  dummy.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  dummy.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  dummy.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  dummy.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  dummy.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  dummy.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  dummy.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  dummy.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  dummy.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  dummy.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  dummy.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  dummy.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  dummy.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  dummy.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  dummy.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  dummy.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  dummy.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  dummy.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  dummy.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  dummy.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  dummy.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  dummy.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  dummy.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  dummy.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  dummy.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  dummy.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  dummy.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  notp2wsh.super_CScriptBase._union._16_8_ = 0;
  notp2wsh.super_CScriptBase._24_8_ = 0;
  notp2wsh.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  notp2wsh.super_CScriptBase._union._8_8_ = 0;
  this_00 = CScript::operator<<(&notp2wsh,OP_1);
  ToByteVector<uint256>((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b0,&dummy);
  b._M_extent._M_extent_value = CONCAT71(uStack_a7,local_a8) - (long)local_b0;
  b._M_ptr = (pointer)local_b0;
  CScript::operator<<(this_00,b);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_b0);
  local_68 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_segwit_tests.cpp"
  ;
  local_60 = "";
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x1d;
  file.m_begin = (iterator)&local_68;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_78,msg);
  bVar2 = CScript::IsPayToWitnessScriptHash(&notp2wsh);
  local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_90.m_message.px = (element_type *)0x0;
  local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_98 = &local_c0;
  local_c0 = "!notp2wsh.IsPayToWitnessScriptHash()";
  local_b8 = "";
  local_a8 = false;
  local_b0 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,(lazy_ostream *)local_b0,1,0,WARN,0xbc24ee,(size_t)&stack0xffffffffffffff30,
             0x1d);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&notp2wsh.super_CScriptBase);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(IsPayToWitnessScriptHash_Invalid_NotOp0)
{
    uint256 dummy;
    CScript notp2wsh;
    notp2wsh << OP_1 << ToByteVector(dummy);
    BOOST_CHECK(!notp2wsh.IsPayToWitnessScriptHash());
}